

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManPrintRuntime(Sbl_Man_t *p)

{
  int level;
  double dVar1;
  double dVar2;
  
  level = 0x979e3a;
  puts("Runtime breakdown:");
  p->timeOther = p->timeTotal - (p->timeWin + p->timeCut + p->timeSat + p->timeTime);
  Abc_Print(level,"%s =","Win   ");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar1);
  Abc_Print(level,"%s =","Cut   ");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeCut * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCut / 1000000.0,dVar1);
  Abc_Print(level,"%s =","Sat   ");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Sat  ");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Unsat");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeSatUns * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUns / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Undec");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeSatUnd * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnd / 1000000.0,dVar1);
  Abc_Print(level,"%s =","Timing");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar1);
  Abc_Print(level,"%s =","Other ");
  dVar1 = 0.0;
  if (p->timeTotal != 0) {
    dVar1 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar1);
  Abc_Print(level,"%s =","ALL   ");
  dVar1 = (double)p->timeTotal;
  dVar2 = 0.0;
  if (p->timeTotal != 0) {
    dVar2 = (dVar1 * 100.0) / dVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar1 / 1000000.0,dVar2);
  return;
}

Assistant:

void Sbl_ManPrintRuntime( Sbl_Man_t * p )
{
    printf( "Runtime breakdown:\n" );
    p->timeOther = p->timeTotal - p->timeWin - p->timeCut - p->timeSat - p->timeTime;
    ABC_PRTP( "Win   ", p->timeWin  ,   p->timeTotal );
    ABC_PRTP( "Cut   ", p->timeCut  ,   p->timeTotal );
    ABC_PRTP( "Sat   ", p->timeSat,     p->timeTotal );
    ABC_PRTP( " Sat  ", p->timeSatSat,  p->timeTotal );
    ABC_PRTP( " Unsat", p->timeSatUns,  p->timeTotal );
    ABC_PRTP( " Undec", p->timeSatUnd,  p->timeTotal );
    ABC_PRTP( "Timing", p->timeTime ,   p->timeTotal );
    ABC_PRTP( "Other ", p->timeOther,   p->timeTotal );
    ABC_PRTP( "ALL   ", p->timeTotal,   p->timeTotal );
}